

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall QFontComboBox::QFontComboBox(QFontComboBox *this,QWidget *parent)

{
  QFontComboBoxPrivate *pQVar1;
  QStringListModel *this_00;
  QFontFamilyDelegate *this_01;
  QObject *object;
  QListView *this_02;
  long in_FS_OFFSET;
  Object local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QFontComboBoxPrivate *)operator_new(0x390);
  QFontComboBoxPrivate::QFontComboBoxPrivate(pQVar1);
  QComboBox::QComboBox(&this->super_QComboBox,(QComboBoxPrivate *)pQVar1,parent);
  *(undefined ***)&(this->super_QComboBox).super_QWidget = &PTR_metaObject_007cce60;
  *(undefined ***)&(this->super_QComboBox).super_QWidget.super_QPaintDevice =
       &PTR__QFontComboBox_007cd030;
  pQVar1 = *(QFontComboBoxPrivate **)&(this->super_QComboBox).super_QWidget.field_0x8;
  QFont::operator=(&pQVar1->currentFont,&((this->super_QComboBox).super_QWidget.data)->fnt);
  QComboBox::setEditable(&this->super_QComboBox,true);
  this_00 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_00,(QObject *)this);
  (**(code **)(*(long *)&(this->super_QComboBox).super_QWidget + 0x1a0))(this,this_00);
  this_01 = (QFontFamilyDelegate *)operator_new(0x30);
  QFontFamilyDelegate::QFontFamilyDelegate(this_01,(QObject *)this,pQVar1);
  QComboBox::setItemDelegate(&this->super_QComboBox,(QAbstractItemDelegate *)this_01);
  object = (QObject *)QComboBox::view(&this->super_QComboBox);
  this_02 = QtPrivate::qobject_cast_helper<QListView*,QObject>(object);
  if (this_02 != (QListView *)0x0) {
    QListView::setUniformItemSizes(this_02,true);
  }
  setWritingSystem(this,Any);
  QObjectPrivate::
  connect<void(QComboBox::*)(QString_const&),void(QFontComboBoxPrivate::*)(QString_const&)>
            ((Object *)&stack0xffffffffffffffd0,(offset_in_QComboBox_to_subr)this,
             (Object *)QComboBox::currentTextChanged,0,(ConnectionType)pQVar1);
  QObjectPrivate::connect<void(QGuiApplication::*)(),void(QFontComboBoxPrivate::*)()>
            (local_28,QCoreApplication::self,(Object *)QGuiApplication::fontDatabaseChanged,0,
             (ConnectionType)pQVar1);
  std::array<QMetaObject::Connection,_2UL>::operator=
            (&pQVar1->connections,(array<QMetaObject::Connection,_2UL> *)&stack0xffffffffffffffd0);
  std::array<QMetaObject::Connection,_2UL>::~array
            ((array<QMetaObject::Connection,_2UL> *)&stack0xffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontComboBox::QFontComboBox(QWidget *parent)
    : QComboBox(*new QFontComboBoxPrivate, parent)
{
    Q_D(QFontComboBox);
    d->currentFont = font();
    setEditable(true);

    QStringListModel *m = new QStringListModel(this);
    setModel(m);
    setItemDelegate(new QFontFamilyDelegate(this, d));
    QListView *lview = qobject_cast<QListView*>(view());
    if (lview)
        lview->setUniformItemSizes(true);
    setWritingSystem(QFontDatabase::Any);

    d->connections = {
        QObjectPrivate::connect(this, &QFontComboBox::currentTextChanged,
                                d, &QFontComboBoxPrivate::currentChanged),
        QObjectPrivate::connect(qApp, &QGuiApplication::fontDatabaseChanged,
                                d, &QFontComboBoxPrivate::updateModel),
    };
}